

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall
AbstractModuleClient::unsubscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule)

{
  bool bVar1;
  string *in_RDX;
  string *in_RSI;
  int retval;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  uint uVar2;
  string local_210 [32];
  HighFreqDataType *in_stack_fffffffffffffe10;
  MlmWrap *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  MlmWrap *in_stack_fffffffffffffe78;
  string local_140 [16];
  HighFreqDataType *in_stack_fffffffffffffed0;
  MlmWrap *in_stack_fffffffffffffed8;
  string local_120 [8];
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  MlmWrap *in_stack_fffffffffffffef8;
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  
  local_1c = -1;
  std::__cxx11::string::string(local_40,in_RSI);
  std::__cxx11::string::string(local_60,in_RDX);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd4);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  if ((uVar2 & 0x1000000) != 0) {
    std::__cxx11::string::string(local_120,in_RSI);
    std::__cxx11::string::string(local_140,in_RDX);
    MlmWrap::getSubbedHfType
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    MlmWrap::removeSubFromList(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    HighFreqDataType::~HighFreqDataType
              ((HighFreqDataType *)CONCAT44(uVar2,in_stack_fffffffffffffdd0));
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe10,in_RSI);
    std::__cxx11::string::string(local_210,in_RDX);
    MlmWrap::getSubbedHfType
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_1c = MlmWrap::removeHfTypeFromSubbedList
                         (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    HighFreqDataType::~HighFreqDataType((HighFreqDataType *)CONCAT44(uVar2,local_1c));
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  }
  return local_1c;
}

Assistant:

int AbstractModuleClient::unsubscribeHighFreqData(std::string dataName, std::string originModule) {
//    std::cout << "mlmWrap: Unsubscribing from [" << dataName << "-" << originModule <<"]\n";
    int retval = -1;
    if (isHfTypeCurrentlySubbed(dataName, originModule)) {
        removeSubFromList(getSubbedHfType(dataName, originModule));
        retval = removeHfTypeFromSubbedList(getSubbedHfType(dataName, originModule));
    }
    return(retval);
}